

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::basic_param::help(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  ostream *poVar1;
  
  (*this->_vptr_basic_param[5])();
  if ((this->p_help)._M_string_length != 0) {
    poVar1 = std::operator<<(ostr,'\n');
    poVar1 = std::operator<<(poVar1,(string *)&this->p_help);
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

virtual void            help( std::ostream& ostr, cstring negation_prefix_ )
    {
        usage( ostr, negation_prefix_ );

        if( !p_help.empty() )
            ostr << '\n' << p_help << '\n';
    }